

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.hpp
# Opt level: O2

anon_class_96_2_1b0831f6 *
DataSuppliment<std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>,std::__cxx11::string(*)(std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>)>
          (anon_class_96_2_1b0831f6 *__return_storage_ptr__,
          tuple<unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard> *needed_data,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
          *f)

{
  anon_class_96_2_1b0831f6 lambda_f_to_return;
  anon_class_96_2_1b0831f6 aStack_78;
  
  std::_Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>::
  _Tuple_impl((_Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard> *)
              &aStack_78,
              &needed_data->
               super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
             );
  aStack_78.f = f;
  DataSuppliment<std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>,std::__cxx11::string(*)(std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>)>(std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>,std::__cxx11::string(*)(std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>))
  ::{lambda()#1}::DataSuppliment((_lambda___1_ *)__return_storage_ptr__,&aStack_78);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&aStack_78);
  return __return_storage_ptr__;
}

Assistant:

auto DataSuppliment(suppliment_t needed_data, function_t f) {
  using dsit_t = DataSupplimentInternalType<suppliment_t>;
  const auto lambda_f_to_return = [=]() {
    const dsit_t depinject_func = dsit_t{needed_data};
    return depinject_func(f);
  };
  return lambda_f_to_return;
}